

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::String::String(String *this,String *b)

{
  int iVar1;
  uchar *puVar2;
  
  iVar1 = (b->super_tagbstring).slen;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < (long)iVar1) {
    puVar2 = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = puVar2;
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 == (uchar *)0x0) {
    Bstrlib::String();
  }
  else {
    memcpy(puVar2,(b->super_tagbstring).data,(long)iVar1);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(const String& b)
    {
        slen = b.slen;
        mlen = slen + 1;
        data = 0;
        if (mlen > 0)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (String) constructor");
        }
        else
        {
            memcpy(data, b.data, slen);
            data[slen] = '\0';
        }
    }